

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

bool EOPlus::check_op(char a,char b)

{
  bool local_1c;
  bool local_1b;
  bool local_1a;
  bool local_19;
  bool local_9;
  char b_local;
  char a_local;
  
  switch(a) {
  case '!':
  case '<':
  case '>':
    local_1c = b == '\0' || b == '=';
    local_9 = local_1c;
    break;
  default:
    local_9 = false;
    break;
  case '%':
  case '*':
  case '/':
    local_9 = b == '\0';
    break;
  case '&':
    local_19 = b == '\0' || b == '&';
    local_9 = local_19;
    break;
  case '(':
  case ')':
  case '+':
    local_9 = b == '\0';
    break;
  case '-':
    local_1b = b == '\0' || b == '\x02';
    local_9 = local_1b;
    break;
  case '=':
    local_9 = b == '=';
    break;
  case '|':
    local_1a = b == '\0' || b == '|';
    local_9 = local_1a;
  }
  return local_9;
}

Assistant:

bool check_op(char a, char b)
	{
		switch (a)
		{
			case '(': case ')': case '+': return b == '\0';
			case '&': return b == '\0' || b == '&';
			case '|': return b == '\0' || b == '|';
			case '-': return b == '\0' || b == UOP_ALT;
			case '*': case '/': case '%': return b == '\0';
			case '<': case '>': case '!': return b == '\0' || b == '=';
			case '=': return b == '=';
			default: return false;
		}
	}